

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ActiveAtomicCounterBuffersCase::iterate
          (ActiveAtomicCounterBuffersCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  ProgramSources *pPVar7;
  TestError *pTVar8;
  string *psVar9;
  string local_5c8;
  ShaderSource local_5a8;
  ProgramSources local_580;
  undefined1 local_4b0 [8];
  ShaderProgram program_2;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  ScopedLogSection local_390;
  ScopedLogSection section_2;
  ShaderSource local_368;
  ProgramSources local_340;
  undefined1 local_270 [8];
  ShaderProgram program_1;
  string local_198;
  allocator<char> local_171;
  string local_170;
  ScopedLogSection local_150;
  ScopedLogSection section_1;
  Program program;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  ActiveAtomicCounterBuffersCase *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar2),pTVar6);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar6,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Initial",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Initial",
             (allocator<char> *)((long)&program.m_info.linkTimeUs + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar6,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&program.m_info.linkTimeUs + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Program::Program((Program *)&section_1,pRVar5);
  dVar3 = glu::Program::getProgram((Program *)&section_1);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             dVar3,0x92d9,0,this->m_verifier);
  glu::Program::~Program((Program *)&section_1);
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"NoBuffers",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"No buffers",
             (allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
  psVar9 = &local_198;
  tcu::ScopedLogSection::ScopedLogSection(&local_150,pTVar6,&local_170,psVar9);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_340);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section_2,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
             ,(char *)psVar9);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_368,(string *)&section_2);
  pPVar7 = glu::ProgramSources::operator<<(&local_340,&local_368);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_270,pRVar5,pPVar7);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_368);
  std::__cxx11::string::~string((string *)&section_2);
  glu::ProgramSources::~ProgramSources(&local_340);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar6,(ShaderProgram *)local_270);
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
         (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_270), bVar1))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_270);
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,dVar3,0x92d9,0,this->m_verifier);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_270);
      tcu::ScopedLogSection::~ScopedLogSection(&local_150);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"OneBuffer",&local_3b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"One buffer",
                 (allocator<char> *)((long)&program_2.m_program.m_info.linkTimeUs + 7));
      psVar9 = &local_3d8;
      tcu::ScopedLogSection::ScopedLogSection(&local_390,pTVar6,&local_3b0,psVar9);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&program_2.m_program.m_info.linkTimeUs + 7));
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator(&local_3b1);
      pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      glu::ProgramSources::ProgramSources(&local_580);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_5c8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) uniform highp atomic_uint u_counters[2];\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = float(atomicCounterIncrement(u_counters[0])) + float(atomicCounterIncrement(u_counters[1]));\n}\n"
                 ,(char *)psVar9);
      glu::ComputeSource::ComputeSource((ComputeSource *)&local_5a8,&local_5c8);
      pPVar7 = glu::ProgramSources::operator<<(&local_580,&local_5a8);
      glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_4b0,pRVar5,pPVar7);
      glu::ComputeSource::~ComputeSource((ComputeSource *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5c8);
      glu::ProgramSources::~ProgramSources(&local_580);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar6,(ShaderProgram *)local_4b0);
      while ((dVar4 = ::deGetFalse(), dVar4 == 0 &&
             (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_4b0), bVar1))) {
        dVar4 = ::deGetFalse();
        if (dVar4 == 0) {
          dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4b0);
          deqp::gls::StateQueryUtil::verifyStateProgramInteger
                    ((ResultCollector *)local_78,
                     (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar3,0x92d9,1,
                     this->m_verifier);
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4b0);
          tcu::ScopedLogSection::~ScopedLogSection(&local_390);
          tcu::ResultCollector::setTestContextResult
                    ((ResultCollector *)local_78,
                     (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
          glu::CallLogWrapper::~CallLogWrapper
                    ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
          return STOP;
        }
      }
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"failed to build program","program.isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                 ,0x260);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"failed to build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x255);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ActiveAtomicCounterBuffersCase::IterateResult ActiveAtomicCounterBuffersCase::iterate (void)
{
	static const char* const	s_computeTemplate0	=	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) uniform highp atomic_uint u_counters[2];\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = float(atomicCounterIncrement(u_counters[0])) + float(atomicCounterIncrement(u_counters[1]));\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Initial", "Initial");
		glu::Program				program		(m_context.getRenderContext());

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "NoBuffers", "No buffers");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate0)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "OneBuffer", "One buffer");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate1)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, 1, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}